

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuronTest.cpp
# Opt level: O1

void __thiscall Neuron_testTeachNegative_Test::TestBody(Neuron_testTeachNegative_Test *this)

{
  bool bVar1;
  Connections *pCVar2;
  ostream *poVar3;
  int iVar4;
  char *message;
  char *in_R9;
  float fVar5;
  AssertionResult gtest_ar_;
  int spiked;
  AssertionResult gtest_ar;
  Neuron n1;
  Neuron n2;
  ofstream fn;
  AssertHelper local_360;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_358;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_350;
  float local_348;
  int local_344;
  string local_340;
  AssertHelper local_320;
  float local_314;
  Neuron local_310;
  Neuron local_2a0;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  Neuron::Neuron(&local_310,10.0,1.0,50.0);
  Neuron::Neuron(&local_2a0,30.0,1.0,50.0);
  Neuron::connectTo(&local_310,&local_2a0,-50.0);
  pCVar2 = Neuron::connections(&local_310);
  local_348 = Connection::weight((pCVar2->
                                 super__Vector_base<Connection,_std::allocator<Connection>_>).
                                 _M_impl.super__Vector_impl_data._M_start);
  std::ofstream::ofstream(&local_230);
  std::ofstream::open((char *)&local_230,0x142423);
  Neuron::spike(&local_310);
  iVar4 = 0;
  Neuron::apply(&local_2a0,50.0,(Connection *)0x0);
  local_344 = 0;
  do {
    local_314 = Neuron::mem(&local_2a0);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&local_230,iVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"; ",2);
    poVar3 = std::ostream::_M_insert<double>((double)local_314);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"; ",2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    Neuron::tick(&local_310,1.0);
    bVar1 = Neuron::tick(&local_2a0,1.0);
    if (bVar1) {
      pCVar2 = Neuron::connections(&local_310);
      fVar5 = Connection::weight((pCVar2->
                                 super__Vector_base<Connection,_std::allocator<Connection>_>).
                                 _M_impl.super__Vector_impl_data._M_start);
      local_358.ptr_._0_1_ = fVar5 < local_348;
      local_350.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_348 <= fVar5) {
        testing::Message::Message((Message *)&local_360);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_340,(internal *)&local_358,
                   (AssertionResult *)"n1.connections()[0].weight() < w","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_320,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
                   ,0xb0,(char *)CONCAT71(local_340._M_dataplus._M_p._1_7_,
                                          (char)local_340._M_dataplus._M_p));
        testing::internal::AssertHelper::operator=(&local_320,(Message *)&local_360);
        testing::internal::AssertHelper::~AssertHelper(&local_320);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_340._M_dataplus._M_p._1_7_,(char)local_340._M_dataplus._M_p) !=
            &local_340.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_340._M_dataplus._M_p._1_7_,(char)local_340._M_dataplus._M_p
                                  ));
        }
        if (local_360.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_360.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_360.data_ + 8))();
          }
          local_360.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_350,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      pCVar2 = Neuron::connections(&local_310);
      local_348 = Connection::weight((pCVar2->
                                     super__Vector_base<Connection,_std::allocator<Connection>_>).
                                     _M_impl.super__Vector_impl_data._M_start);
      local_344 = local_344 + 1;
    }
    if (iVar4 < 0x140) {
      if (iVar4 == 0xb4) {
        bVar1 = Neuron::apply(&local_2a0,50.0,(Connection *)0x0);
        local_358.ptr_._0_1_ = bVar1;
        local_350.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!bVar1) {
          testing::Message::Message((Message *)&local_360);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_340,(internal *)&local_358,(AssertionResult *)"n2.apply(50)","false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_320,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
                     ,0xb6,(char *)CONCAT71(local_340._M_dataplus._M_p._1_7_,
                                            (char)local_340._M_dataplus._M_p));
          testing::internal::AssertHelper::operator=(&local_320,(Message *)&local_360);
          testing::internal::AssertHelper::~AssertHelper(&local_320);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_340._M_dataplus._M_p._1_7_,(char)local_340._M_dataplus._M_p) !=
              &local_340.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_340._M_dataplus._M_p._1_7_,
                                     (char)local_340._M_dataplus._M_p));
          }
          if (local_360.data_ != (AssertHelperData *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) && (local_360.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_360.data_ + 8))();
            }
            local_360.data_ = (AssertHelperData *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_350,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
        goto LAB_0011fe32;
      }
      if (iVar4 == 200) {
        Neuron::spike(&local_310);
      }
    }
    else {
LAB_0011fe32:
      if (iVar4 == 0x140) {
        bVar1 = Neuron::apply(&local_2a0,50.0,(Connection *)0x0);
        local_358.ptr_._0_1_ = bVar1;
        local_350.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!bVar1) {
          testing::Message::Message((Message *)&local_360);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_340,(internal *)&local_358,(AssertionResult *)"n2.apply(50)","false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_320,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
                     ,0xbc,(char *)CONCAT71(local_340._M_dataplus._M_p._1_7_,
                                            (char)local_340._M_dataplus._M_p));
          testing::internal::AssertHelper::operator=(&local_320,(Message *)&local_360);
          testing::internal::AssertHelper::~AssertHelper(&local_320);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_340._M_dataplus._M_p._1_7_,(char)local_340._M_dataplus._M_p) !=
              &local_340.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_340._M_dataplus._M_p._1_7_,
                                     (char)local_340._M_dataplus._M_p));
          }
          if (local_360.data_ != (AssertHelperData *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) && (local_360.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_360.data_ + 8))();
            }
            local_360.data_ = (AssertHelperData *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_350,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
      }
      if (iVar4 == 0x14a) {
        Neuron::spike(&local_310);
      }
    }
    iVar4 = iVar4 + 1;
    if (iVar4 == 600) {
      local_358.ptr_._0_4_ = 2;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&local_340,"2","spiked",(int *)&local_358,&local_344);
      if ((char)local_340._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_358);
        if ((undefined8 *)local_340._M_string_length == (undefined8 *)0x0) {
          message = "";
        }
        else {
          message = *(char **)local_340._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_360,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
                   ,0xc2,message);
        testing::internal::AssertHelper::operator=(&local_360,(Message *)&local_358);
        testing::internal::AssertHelper::~AssertHelper(&local_360);
        if (local_358.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_358.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_358.ptr_ + 8))();
          }
          local_358.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_340._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_230 = _VTT;
      *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = ___throw_bad_array_new_length;
      std::filebuf::~filebuf(local_228);
      std::ios_base::~ios_base(local_138);
      std::
      vector<std::vector<Neuron_*,_std::allocator<Neuron_*>_>,_std::allocator<std::vector<Neuron_*,_std::allocator<Neuron_*>_>_>_>
      ::~vector(&local_2a0.m_watchFor);
      if (local_2a0.m_incomingSpikes.super__Vector_base<Connection_*,_std::allocator<Connection_*>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2a0.m_incomingSpikes.
                        super__Vector_base<Connection_*,_std::allocator<Connection_*>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_2a0.m_connections.super__Vector_base<Connection,_std::allocator<Connection>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2a0.m_connections.
                        super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      std::
      vector<std::vector<Neuron_*,_std::allocator<Neuron_*>_>,_std::allocator<std::vector<Neuron_*,_std::allocator<Neuron_*>_>_>_>
      ::~vector(&local_310.m_watchFor);
      if (local_310.m_incomingSpikes.super__Vector_base<Connection_*,_std::allocator<Connection_*>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_310.m_incomingSpikes.
                        super__Vector_base<Connection_*,_std::allocator<Connection_*>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_310.m_connections.super__Vector_base<Connection,_std::allocator<Connection>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_310.m_connections.
                        super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      return;
    }
  } while( true );
}

Assistant:

TEST(Neuron, testTeachNegative)
{
    Neuron n1;
    Neuron n2(30);
    n1.connectTo(&n2, -50.0f);
    float w = n1.connections()[0].weight();
    std::ofstream fn;
    fn.open("testTeachNegative.csv");

    n1.spike();
    n2.apply(50);
    int spiked = 0;
    for (int t = 0; t < 600; ++t) {
        float mem = n2.mem();
        fn << t << "; " << mem << "; " << std::endl;
        n1.tick(TIME_STEP);
        if (n2.tick(TIME_STEP)) {
            EXPECT_TRUE(n1.connections()[0].weight() < w);
            w = n1.connections()[0].weight();
            ++spiked;
        }

        if (t == 180)
            EXPECT_TRUE(n2.apply(50));

        if (t == 200)
            n1.spike();

        if (t == 320)
            EXPECT_TRUE(n2.apply(50));

        if (t == 330)
            n1.spike();

    }
    EXPECT_EQ(2, spiked);
}